

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemeditorfactory.cpp
# Opt level: O0

void __thiscall QBooleanComboBox::QBooleanComboBox(QBooleanComboBox *this,QWidget *parent)

{
  QComboBox *in_RDI;
  long in_FS_OFFSET;
  int in_stack_ffffffffffffff3c;
  char *in_stack_ffffffffffffff40;
  QVariant *auserData;
  QString *atext;
  QComboBox *this_00;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  QString local_60;
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QComboBox::QComboBox
            (in_RDI,(QWidget *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  *(undefined ***)&in_RDI->super_QWidget = &PTR_metaObject_00d2d1f0;
  *(undefined ***)&(in_RDI->super_QWidget).super_QPaintDevice = &PTR__QBooleanComboBox_00d2d3c0;
  this_00 = (QComboBox *)0x0;
  atext = &local_60;
  QComboBox::tr((char *)atext,in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
  auserData = &local_28;
  ::QVariant::QVariant((QVariant *)0x85847e);
  QComboBox::addItem(this_00,atext,auserData);
  ::QVariant::~QVariant(auserData);
  QString::~QString((QString *)0x8584a6);
  QComboBox::tr((char *)atext,(char *)auserData,in_stack_ffffffffffffff3c);
  ::QVariant::QVariant((QVariant *)0x8584d7);
  QComboBox::addItem(this_00,atext,auserData);
  ::QVariant::~QVariant(&local_48);
  QString::~QString((QString *)0x8584ff);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QBooleanComboBox::QBooleanComboBox(QWidget *parent)
    : QComboBox(parent)
{
    addItem(QComboBox::tr("False"));
    addItem(QComboBox::tr("True"));
}